

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UBool insertRootBundle(UResourceDataEntry **t1,UErrorCode *status)

{
  UBool UVar1;
  UResourceDataEntry *pUVar2;
  UResourceDataEntry *t2;
  UErrorCode *pUStack_20;
  UErrorCode parentStatus;
  UErrorCode *status_local;
  UResourceDataEntry **t1_local;
  
  pUStack_20 = status;
  status_local = (UErrorCode *)t1;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    t2._4_4_ = U_ZERO_ERROR;
    pUVar2 = init_entry("root",*(char **)(*(undefined8 *)status_local + U_INDEX_OUTOFBOUNDS_ERROR),
                        (UErrorCode *)((long)&t2 + 4));
    UVar1 = U_FAILURE(t2._4_4_);
    if (UVar1 == '\0') {
      *(UResourceDataEntry **)(*(undefined8 *)status_local + U_UNSUPPORTED_ERROR) = pUVar2;
      *(UResourceDataEntry **)status_local = pUVar2;
      t1_local._7_1_ = '\x01';
    }
    else {
      *pUStack_20 = t2._4_4_;
      t1_local._7_1_ = '\0';
    }
  }
  else {
    t1_local._7_1_ = '\0';
  }
  return t1_local._7_1_;
}

Assistant:

static UBool  // returns U_SUCCESS(*status)
insertRootBundle(UResourceDataEntry *&t1, UErrorCode *status) {
    if (U_FAILURE(*status)) { return FALSE; }
    UErrorCode parentStatus = U_ZERO_ERROR;
    UResourceDataEntry *t2 = init_entry(kRootLocaleName, t1->fPath, &parentStatus);
    if (U_FAILURE(parentStatus)) {
        *status = parentStatus;
        return FALSE;
    }
    t1->fParent = t2;
    t1 = t2;
    return TRUE;
}